

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.h
# Opt level: O0

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type::Enum>
          (TypeChecker *this,Result result,char *desc,Enum args)

{
  initializer_list<wabt::Type> __l;
  char *desc_00;
  bool bVar1;
  allocator<wabt::Type> local_61;
  Type local_60;
  iterator local_58;
  size_type local_50;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  Result local_2c;
  Enum local_28;
  Enum local_24;
  char *pcStack_20;
  Enum args_local;
  char *desc_local;
  TypeChecker *this_local;
  Result result_local;
  
  local_28 = result.enum_;
  local_24 = args;
  pcStack_20 = desc;
  desc_local = (char *)this;
  this_local._4_4_ = result.enum_;
  bVar1 = Failed(result);
  desc_00 = pcStack_20;
  if (bVar1) {
    local_2c.enum_ = this_local._4_4_;
    Type::Type(&local_60,local_24);
    local_58 = &local_60;
    local_50 = 1;
    std::allocator<wabt::Type>::allocator(&local_61);
    __l._M_len = local_50;
    __l._M_array = local_58;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_48,__l,&local_61);
    PrintStackIfFailedV(this,local_2c,desc_00,&local_48,false);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_48);
    std::allocator<wabt::Type>::~allocator(&local_61);
  }
  return;
}

Assistant:

void PrintStackIfFailed(Result result, const char* desc, Args... args) {
    // Assert all args are Type or Type::Enum. If it's a TypeVector then
    // PrintStackIfFailedV() should be used instead.
    static_assert((std::is_constructible_v<Type, Args> && ...));
    // Minor optimization, check result before constructing the vector to pass
    // to the other overload of PrintStackIfFailed.
    if (Failed(result)) {
      PrintStackIfFailedV(result, desc, {args...}, /*is_end=*/false);
    }
  }